

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

void __thiscall Assimp::XGLImporter::ReadWorld(XGLImporter *this,TempScope *scope)

{
  bool bVar1;
  allocator<char> local_79;
  string local_78;
  aiNode *local_58;
  aiNode *nd;
  string local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *s;
  TempScope *scope_local;
  XGLImporter *this_local;
  
  s = (string *)scope;
  scope_local = (TempScope *)this;
  do {
    bVar1 = ReadElementUpToClosing(this,"world");
    if (!bVar1) break;
    GetElementName_abi_cxx11_(&local_40,this);
    local_20 = &local_40;
    bVar1 = std::operator==(&local_40,"lighting");
    if (bVar1) {
      ReadLighting(this,(TempScope *)s);
LAB_009d0ffc:
      nd._0_4_ = 0;
    }
    else {
      bVar1 = std::operator==(local_20,"object");
      if (((!bVar1) && (bVar1 = std::operator==(local_20,"mesh"), !bVar1)) &&
         (bVar1 = std::operator==(local_20,"mat"), !bVar1)) goto LAB_009d0ffc;
      nd._0_4_ = 3;
    }
    std::__cxx11::string::~string((string *)&local_40);
  } while ((int)nd == 0);
  local_58 = ReadObject(this,(TempScope *)s,true,"world");
  if (local_58 == (aiNode *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"failure reading <world>",&local_79);
    LogFunctions<Assimp::XGLImporter>::ThrowException(&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  if ((local_58->mName).length == 0) {
    aiString::Set(&local_58->mName,"WORLD");
  }
  this->m_scene->mRootNode = local_58;
  return;
}

Assistant:

void XGLImporter::ReadWorld(TempScope& scope)
{
    while (ReadElementUpToClosing("world")) {
        const std::string& s = GetElementName();
        // XXX right now we'd skip <lighting> if it comes after
        // <object> or <mesh>
        if (s == "lighting") {
            ReadLighting(scope);
        }
        else if (s == "object" || s == "mesh" || s == "mat") {
            break;
        }
    }


    aiNode* const nd = ReadObject(scope,true,"world");
    if(!nd) {
        ThrowException("failure reading <world>");
    }
    if(!nd->mName.length) {
        nd->mName.Set("WORLD");
    }

    m_scene->mRootNode = nd;
}